

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::findNearestMatch_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  string *psVar4;
  int iVar5;
  void *pvVar6;
  _Rb_tree_node_base *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  size_t __n_00;
  size_type __n;
  ulong uVar10;
  undefined8 uVar11;
  int maxDistance;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  string_view right;
  string_view left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long local_40;
  string *local_38;
  
  right._M_str = arg._M_str;
  __n_00 = arg._M_len;
  if (2 < __n_00) {
    pvVar6 = memchr(right._M_str,0x3d,__n_00);
    uVar9 = (long)pvVar6 - (long)right._M_str;
    uVar10 = uVar9;
    if (__n_00 < uVar9) {
      uVar10 = __n_00;
    }
    if (uVar9 == 0xffffffffffffffff) {
      uVar10 = __n_00;
    }
    if (pvVar6 == (void *)0x0) {
      uVar10 = __n_00;
    }
    p_Var7 = (this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = &(this->optionMap)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var13) {
      maxDistance = 5;
      p_Var12 = (_Base_ptr)0x0;
      local_40 = 0;
      local_38 = __return_storage_ptr__;
      do {
        if ((**(char **)(p_Var7 + 1) != '+') &&
           (right._M_len = uVar10, left._M_str = *(char **)(p_Var7 + 1),
           left._M_len = (size_t)p_Var7[1]._M_parent,
           iVar5 = editDistance(left,right,true,maxDistance), iVar5 < maxDistance)) {
          local_40 = *(long *)(p_Var7 + 1);
          p_Var12 = p_Var7[1]._M_parent;
          maxDistance = iVar5;
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        psVar4 = local_38;
      } while ((_Rb_tree_header *)p_Var7 != p_Var13);
      __return_storage_ptr__ = local_38;
      if (p_Var12 != (_Base_ptr)0x0) {
        paVar2 = &local_60.field_2;
        local_60._M_dataplus._M_p = (pointer)paVar2;
        if (p_Var12 == (_Base_ptr)0x1) {
          local_60.field_2._M_allocated_capacity._0_2_ = 0x2d;
          local_60._M_string_length = 1;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,local_40,local_40 + 1)
          ;
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != paVar2) {
            uVar10 = CONCAT53(local_60.field_2._M_allocated_capacity._3_5_,
                              CONCAT12(local_60.field_2._M_local_buf[2],
                                       local_60.field_2._M_allocated_capacity._0_2_));
          }
          if (uVar10 < local_80._M_string_length + local_60._M_string_length) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              uVar11 = local_80.field_2._M_allocated_capacity;
            }
            if (local_80._M_string_length + local_60._M_string_length <= (ulong)uVar11) {
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_80,0,0,local_60._M_dataplus._M_p,local_60._M_string_length)
              ;
              goto LAB_007164a5;
            }
          }
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_60,local_80._M_dataplus._M_p,local_80._M_string_length);
        }
        else {
          local_60.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
          local_60._M_string_length = 2;
          local_60.field_2._M_local_buf[2] = '\0';
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,local_40,(long)&p_Var12->_M_color + local_40);
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != paVar2) {
            uVar10 = CONCAT53(local_60.field_2._M_allocated_capacity._3_5_,
                              CONCAT12(local_60.field_2._M_local_buf[2],
                                       local_60.field_2._M_allocated_capacity._0_2_));
          }
          if (uVar10 < local_80._M_string_length + local_60._M_string_length) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              uVar11 = local_80.field_2._M_allocated_capacity;
            }
            if (local_80._M_string_length + local_60._M_string_length <= (ulong)uVar11) {
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_80,0,0,local_60._M_dataplus._M_p,local_60._M_string_length)
              ;
              goto LAB_007164a5;
            }
          }
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_60,local_80._M_dataplus._M_p,local_80._M_string_length);
        }
LAB_007164a5:
        (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        pcVar3 = (pbVar8->_M_dataplus)._M_p;
        paVar1 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar1) {
          uVar11 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          (psVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar11;
        }
        else {
          (psVar4->_M_dataplus)._M_p = pcVar3;
          (psVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        psVar4->_M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar8->_M_string_length = 0;
        paVar1->_M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == paVar2) {
          return psVar4;
        }
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT53(local_60.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_60.field_2._M_local_buf[2],
                                          local_60.field_2._M_allocated_capacity._0_2_)) + 1);
        return psVar4;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::findNearestMatch(std::string_view arg) const {
    if (arg.length() <= 2)
        return {};

    size_t equalsIndex = arg.find_first_of('=');
    if (equalsIndex != std::string_view::npos)
        arg = arg.substr(0, equalsIndex);

    std::string_view bestName;
    int bestDistance = 5;

    for (auto& [key, value] : optionMap) {
        if (key[0] == '+')
            continue;

        int dist = editDistance(key, arg, /* allowReplacements */ true, bestDistance);
        if (dist < bestDistance) {
            bestName = key;
            bestDistance = dist;
        }
    }

    if (bestName.empty())
        return {};

    if (bestName.length() == 1)
        return "-"s + std::string(bestName);

    return "--"s + std::string(bestName);
}